

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O2

void __thiscall
leveldb::FilterBlockBuilder::StartBlock(FilterBlockBuilder *this,uint64_t block_offset)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (block_offset >> 0xb < (ulong)((long)puVar2 - (long)puVar3 >> 2)) {
    __assert_fail("filter_index >= filter_offsets_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/filter_block.cc"
                  ,0x17,"void leveldb::FilterBlockBuilder::StartBlock(uint64_t)");
  }
  while ((ulong)((long)puVar2 - (long)puVar3 >> 2) < block_offset >> 0xb) {
    GenerateFilter(this);
    puVar3 = (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void FilterBlockBuilder::StartBlock(uint64_t block_offset) {
  uint64_t filter_index = (block_offset / kFilterBase);
  assert(filter_index >= filter_offsets_.size());
  while (filter_index > filter_offsets_.size()) {
    GenerateFilter();
  }
}